

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>::templated_iterator<const_slang::ast::SubroutineSymbol_*>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::ast::SubroutineSymbol_const*,slang::ast::SubroutineSymbol_const*,std::hash<slang::ast::SubroutineSymbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::SubroutineSymbol_const*>>,std::equal_to<slang::ast::SubroutineSymbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::SubroutineSymbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::SubroutineSymbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::SubroutineSymbol_const*>,4ul>>
::emplace<slang::ast::SubroutineSymbol_const*>
          (sherwood_v3_table<slang::ast::SubroutineSymbol_const*,slang::ast::SubroutineSymbol_const*,std::hash<slang::ast::SubroutineSymbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::SubroutineSymbol_const*>>,std::equal_to<slang::ast::SubroutineSymbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::SubroutineSymbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::SubroutineSymbol_const*>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::SubroutineSymbol_const*>,4ul>>
           *this,SubroutineSymbol **key)

{
  EntryPointer psVar1;
  long lVar2;
  EntryPointer psVar3;
  char distance_from_desired;
  EntryPointer current_entry;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>::templated_iterator<const_slang::ast::SubroutineSymbol_*>,_bool>
  pVar4;
  
  lVar2 = ((ulong)((long)*key * -0x61c8864680b583eb) >> ((byte)this[0x18] & 0x3f)) * 0x10;
  current_entry = (EntryPointer)(*(long *)(this + 8) + lVar2);
  if (*(char *)(*(long *)(this + 8) + lVar2) < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar3 = current_entry;
    do {
      if (*key == (psVar3->field_1).value) {
        pVar4._8_8_ = 0;
        pVar4.first.current = psVar3;
        return pVar4;
      }
      current_entry = psVar3 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar3 + 1;
      psVar3 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar4 = emplace_new_key<slang::ast::SubroutineSymbol_const*>
                    (this,distance_from_desired,current_entry,key);
  return pVar4;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }